

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValue.cpp
# Opt level: O1

XMLCh * xercesc_4_0::XSValue::getCanRepStrings
                  (XMLCh *content,DataType datatype,Status *status,XMLVersion version,
                  bool toValidate,MemoryManager *manager)

{
  short *psVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  XMLCh *pXVar6;
  undefined4 extraout_var_00;
  long lVar7;
  short *psVar8;
  XMLCh *pXVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Status SVar10;
  XMLCh *pXVar11;
  undefined2 *__src;
  size_t sVar12;
  ArrayJanitor<char16_t> janTmpName;
  ArrayJanitor<char16_t> AStack_38;
  
  if (datatype - dt_anyURI < 0xf) {
LAB_00296964:
    if (toValidate) {
      bVar4 = validateStrings(content,datatype,status,version,manager);
      SVar10 = st_FOCA0002;
      if (!bVar4) goto LAB_00296985;
    }
    SVar10 = st_NoCanRep;
LAB_00296985:
    *status = SVar10;
    return (XMLCh *)0x0;
  }
  if (0xd < (int)datatype) {
    if (datatype != dt_hexBinary) {
      if (datatype != dt_base64Binary) {
        return (XMLCh *)0x0;
      }
      pXVar6 = Base64::getCanonicalRepresentation(content,manager,Conf_RFC2045);
      if (pXVar6 != (XMLCh *)0x0) {
        return pXVar6;
      }
      *status = st_FOCA0002;
      return (XMLCh *)0x0;
    }
    if (content == (XMLCh *)0x0) {
      pXVar6 = (XMLCh *)0x0;
    }
    else {
      sVar12 = 0;
      do {
        psVar8 = (short *)((long)content + sVar12);
        sVar12 = sVar12 + 2;
      } while (*psVar8 != 0);
      iVar5 = (*manager->_vptr_MemoryManager[3])(manager,sVar12);
      pXVar6 = (XMLCh *)CONCAT44(extraout_var_00,iVar5);
      memcpy(pXVar6,content,sVar12);
    }
    ArrayJanitor<char16_t>::ArrayJanitor(&AStack_38,pXVar6,manager);
    XMLString::trim(pXVar6);
    pXVar6 = HexBin::getCanonicalRepresentation(pXVar6,manager);
    if (pXVar6 == (XMLCh *)0x0) {
      *status = st_FOCA0002;
    }
    goto LAB_00296bb8;
  }
  if (datatype == dt_string) goto LAB_00296964;
  if (datatype != dt_boolean) {
    return (XMLCh *)0x0;
  }
  if (content == (XMLCh *)0x0) {
    pXVar6 = (XMLCh *)0x0;
  }
  else {
    sVar12 = 0;
    do {
      psVar8 = (short *)((long)content + sVar12);
      sVar12 = sVar12 + 2;
    } while (*psVar8 != 0);
    iVar5 = (*manager->_vptr_MemoryManager[3])(manager,sVar12);
    pXVar6 = (XMLCh *)CONCAT44(extraout_var,iVar5);
    memcpy(pXVar6,content,sVar12);
  }
  ArrayJanitor<char16_t>::ArrayJanitor(&AStack_38,pXVar6,manager);
  XMLString::trim(pXVar6);
  if (pXVar6 == L"false") {
LAB_00296b81:
    sVar12 = 0;
    do {
      psVar8 = (short *)((long)&XMLUni::fgBooleanValueSpace + sVar12);
      sVar12 = sVar12 + 2;
    } while (*psVar8 != 0);
    iVar5 = (*manager->_vptr_MemoryManager[3])(manager,sVar12);
    pXVar6 = (XMLCh *)CONCAT44(extraout_var_02,iVar5);
    __src = &XMLUni::fgBooleanValueSpace;
  }
  else {
    if (pXVar6 == (XMLCh *)0x0) {
      psVar8 = &XMLUni::fgBooleanValueSpace;
LAB_00296aea:
      if ((*psVar8 != 0) && (pXVar6 != L"0")) goto LAB_00296b04;
      goto LAB_00296b81;
    }
    lVar7 = 0;
    do {
      psVar8 = (short *)((long)pXVar6 + lVar7);
      if (*psVar8 == 0) {
        psVar8 = (short *)((long)&XMLUni::fgBooleanValueSpace + lVar7);
        goto LAB_00296aea;
      }
      psVar1 = (short *)((long)&XMLUni::fgBooleanValueSpace + lVar7);
      lVar7 = lVar7 + 2;
    } while (*psVar8 == *psVar1);
    if (pXVar6 == L"0") goto LAB_00296b81;
LAB_00296b04:
    pXVar9 = L"0";
    pXVar11 = pXVar6;
    if (pXVar6 == (XMLCh *)0x0) {
LAB_00296b31:
      if (*pXVar9 == L'\0') goto LAB_00296b81;
    }
    else {
      do {
        XVar2 = *pXVar11;
        if (XVar2 == L'\0') goto LAB_00296b31;
        XVar3 = *pXVar9;
        pXVar9 = pXVar9 + 1;
        pXVar11 = pXVar11 + 1;
      } while (XVar2 == XVar3);
    }
    __src = &DAT_00367850;
    bVar4 = XMLString::equals(pXVar6,L"true");
    if ((!bVar4) && (bVar4 = XMLString::equals(pXVar6,L"1"), !bVar4)) {
      *status = st_FOCA0002;
      pXVar6 = (XMLCh *)0x0;
      goto LAB_00296bb8;
    }
    sVar12 = 0;
    do {
      psVar8 = (short *)((long)&DAT_00367850 + sVar12);
      sVar12 = sVar12 + 2;
    } while (*psVar8 != 0);
    iVar5 = (*manager->_vptr_MemoryManager[3])(manager,sVar12);
    pXVar6 = (XMLCh *)CONCAT44(extraout_var_01,iVar5);
  }
  memcpy(pXVar6,__src,sVar12);
LAB_00296bb8:
  ArrayJanitor<char16_t>::~ArrayJanitor(&AStack_38);
  return pXVar6;
}

Assistant:

XMLCh* XSValue::getCanRepStrings(const XMLCh*         const content
                               ,       DataType             datatype
                               ,       Status&              status
                               ,       XMLVersion           version
                               ,       bool                 toValidate
                               ,       MemoryManager* const manager)
{
    switch (datatype) {
        case XSValue::dt_boolean:
            {
            XMLCh* tmpStrValue = XMLString::replicate(content, manager);
            ArrayJanitor<XMLCh> janTmpName(tmpStrValue, manager);
            XMLString::trim(tmpStrValue);
            //always validate before getting canRep
            if (XMLString::equals(tmpStrValue, XMLUni::fgBooleanValueSpace[0]) ||
                XMLString::equals(tmpStrValue, XMLUni::fgBooleanValueSpace[2])  )
            {
                return XMLString::replicate(XMLUni::fgBooleanValueSpace[0], manager);
            }
            else if (XMLString::equals(tmpStrValue, XMLUni::fgBooleanValueSpace[1]) ||
                     XMLString::equals(tmpStrValue, XMLUni::fgBooleanValueSpace[3])  )
            {
                return XMLString::replicate(XMLUni::fgBooleanValueSpace[1], manager);
            }
            else
            {
                status = st_FOCA0002;
                return 0;
            }
            }
            break;
        case XSValue::dt_hexBinary:
            {
                //HexBin::getCanonicalRepresentation does validation automatically
                XMLCh* tmpStrValue = XMLString::replicate(content, manager);
                ArrayJanitor<XMLCh> janTmpName(tmpStrValue, manager);
                XMLString::trim(tmpStrValue);

                XMLCh* canRep = HexBin::getCanonicalRepresentation(tmpStrValue, manager);
                if (!canRep)
                    status = st_FOCA0002;

                return canRep;
                break;
            }
        case XSValue::dt_base64Binary:
            {
                //Base64::getCanonicalRepresentation does validation automatically
                XMLCh* canRep = Base64::getCanonicalRepresentation(content, manager);
                if (!canRep)
                    status = st_FOCA0002;

                return canRep;
                break;
            }
        case XSValue::dt_anyURI:
        case XSValue::dt_QName:
        case XSValue::dt_NOTATION:
        case XSValue::dt_string:
        case XSValue::dt_normalizedString:
        case XSValue::dt_token:
        case XSValue::dt_language:
        case XSValue::dt_NMTOKEN:
        case XSValue::dt_NMTOKENS:
        case XSValue::dt_Name:
        case XSValue::dt_NCName:
        case XSValue::dt_ID:
        case XSValue::dt_IDREF:
        case XSValue::dt_ENTITY:
        case XSValue::dt_ENTITIES:
        case XSValue::dt_IDREFS:
            if (toValidate && !validateStrings(content, datatype, status, version, manager))
                status = st_FOCA0002;
            else
                status = st_NoCanRep;

            return 0;
            break;
        default:
            return 0;
            break;
    }

    return 0;
}